

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O3

void __thiscall YAML::Scanner::ScanToNextToken(Scanner *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  RegEx *pRVar4;
  RegEx local_68;
  vector<YAML::RegEx,_std::allocator<YAML::RegEx>_> *local_48;
  StreamCharSource local_40;
  
  local_48 = &Exp::Comment::e.m_params;
LAB_0071257f:
  do {
    bVar1 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
    if (bVar1) {
      cVar2 = YAML::Stream::peek(&this->INPUT);
      if ((cVar2 == ' ') || (cVar2 == '\t')) {
        if ((this->m_flows).c.
            super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->m_flows).c.
            super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          if (Exp::Tab()::e == '\0') {
            iVar3 = __cxa_guard_acquire(&Exp::Tab()::e);
            if (iVar3 != 0) {
              RegEx::RegEx(&Exp::Tab::e,'\t');
              __cxa_atexit(RegEx::~RegEx,&Exp::Tab::e,&__dso_handle);
              __cxa_guard_release(&Exp::Tab()::e);
            }
          }
          local_68.m_op = REGEX_EMPTY;
          local_68.m_a = '\0';
          local_68.m_z = '\0';
          local_68._6_2_ = 0;
          local_68.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)this;
          iVar3 = RegEx::Match<YAML::StreamCharSource>(&Exp::Tab::e,(StreamCharSource *)&local_68);
          if (-1 < iVar3) {
            this->m_simpleKeyAllowed = false;
          }
        }
        YAML::Stream::eat(&this->INPUT,1);
        goto LAB_0071257f;
      }
    }
    if (Exp::Comment()::e == '\0') {
      iVar3 = __cxa_guard_acquire(&Exp::Comment()::e);
      if (iVar3 != 0) {
        RegEx::RegEx(&Exp::Comment::e,'#');
        __cxa_atexit(RegEx::~RegEx,&Exp::Comment::e,&__dso_handle);
        __cxa_guard_release(&Exp::Comment()::e);
      }
    }
    local_68.m_a = Exp::Comment::e.m_a;
    local_68.m_z = Exp::Comment::e.m_z;
    local_68.m_op = Exp::Comment::e.m_op;
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::vector(&local_68.m_params,local_48);
    local_40.m_offset = 0;
    local_40.m_stream = &this->INPUT;
    iVar3 = RegEx::Match<YAML::StreamCharSource>(&local_68,&local_40);
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_68.m_params);
    if (-1 < iVar3) {
      while( true ) {
        bVar1 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
        if (!bVar1) break;
        pRVar4 = Exp::Break();
        local_68.m_op = REGEX_EMPTY;
        local_68.m_a = '\0';
        local_68.m_z = '\0';
        local_68._6_2_ = 0;
        local_68.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this;
        iVar3 = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_68);
        if (-1 < iVar3) break;
        YAML::Stream::eat(&this->INPUT,1);
      }
    }
    pRVar4 = Exp::Break();
    local_68.m_op = REGEX_EMPTY;
    local_68.m_a = '\0';
    local_68.m_z = '\0';
    local_68._6_2_ = 0;
    local_68.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    iVar3 = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_68);
    if (iVar3 < 0) {
      return;
    }
    pRVar4 = Exp::Break();
    local_68.m_op = REGEX_EMPTY;
    local_68.m_a = '\0';
    local_68.m_z = '\0';
    local_68._6_2_ = 0;
    local_68.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    iVar3 = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_68);
    YAML::Stream::eat(&this->INPUT,iVar3);
    InvalidateSimpleKey(this);
    if ((this->m_flows).c.
        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->m_flows).c.
        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      this->m_simpleKeyAllowed = true;
    }
  } while( true );
}

Assistant:

void Scanner::ScanToNextToken() {
  while (true) {
    // first eat whitespace
    while (INPUT && IsWhitespaceToBeEaten(INPUT.peek())) {
      if (InBlockContext() && Exp::Tab().Matches(INPUT)) {
        m_simpleKeyAllowed = false;
      }
      INPUT.eat(1);
    }

    // then eat a comment
    if (Exp::Comment().Matches(INPUT)) {
      // eat until line break
      while (INPUT && !Exp::Break().Matches(INPUT)) {
        INPUT.eat(1);
      }
    }

    // if it's NOT a line break, then we're done!
    if (!Exp::Break().Matches(INPUT)) {
      break;
    }

    // otherwise, let's eat the line break and keep going
    int n = Exp::Break().Match(INPUT);
    INPUT.eat(n);

    // oh yeah, and let's get rid of that simple key
    InvalidateSimpleKey();

    // new line - we may be able to accept a simple key now
    if (InBlockContext()) {
      m_simpleKeyAllowed = true;
    }
  }
}